

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleSphere.h
# Opt level: O0

void __thiscall
pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>::GradX<Fad<double>>
          (TPZTriangleSphere<pzgeom::TPZGeoTriangle> *this,TPZFMatrix<double> *cornerco,
          TPZVec<Fad<double>_> *par,TPZFMatrix<Fad<double>_> *gradx)

{
  int64_t iVar1;
  TPZFMatrix<Fad<double>_> *this_00;
  TPZFMatrix<Fad<double>_> *A;
  Fad<double> *val;
  TPZFMatrix<Fad<double>_> *A_00;
  Fad<double> *v;
  Fad<double> *w;
  TPZFMatrix<Fad<double>_> *this_01;
  Fad<double> *fadexpr;
  TPZManVector<Fad<double>,_3> *this_02;
  Fad<double> *pFVar2;
  TPZFMatrix<Fad<double>_> *this_03;
  Fad<double> b;
  Fad<double> a;
  TPZFNMatrix<9,_Fad<double>_> GradXt;
  Fad<double> NormValue;
  int i;
  TPZVec<double> Xc;
  TPZFNMatrix<3,_Fad<double>_> XtminusXc;
  TPZFNMatrix<9,_Fad<double>_> GradXtScaled;
  TPZFNMatrix<9,_Fad<double>_> TensorXtGradX;
  TPZFNMatrix<9,_Fad<double>_> GradOneoverNorm;
  TPZManVector<Fad<double>,_3> XTriangle;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff0f8;
  TPZFNMatrix<9,_Fad<double>_> *in_stack_fffffffffffff100;
  TPZVec<double> *in_stack_fffffffffffff108;
  TPZVec<double> *in_stack_fffffffffffff110;
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *in_stack_fffffffffffff118;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff120;
  Fad<double> *in_stack_fffffffffffff130;
  Fad<double> *in_stack_fffffffffffff138;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff140;
  Fad<double> *in_stack_fffffffffffff148;
  TPZFNMatrix<9,_Fad<double>_> *in_stack_fffffffffffff150;
  Fad<double> *in_stack_fffffffffffff158;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff160;
  Fad<double> *in_stack_fffffffffffff178;
  int64_t in_stack_fffffffffffff180;
  int64_t in_stack_fffffffffffff188;
  TPZFNMatrix<9,_Fad<double>_> *in_stack_fffffffffffff190;
  Fad<double> *in_stack_fffffffffffff1a0;
  int64_t in_stack_fffffffffffff1a8;
  TPZManVector<Fad<double>,_3> *in_stack_fffffffffffff1b0;
  TPZVec<Fad<double>_> *in_stack_fffffffffffff3d0;
  TPZVec<Fad<double>_> *in_stack_fffffffffffff3d8;
  TPZFMatrix<double> *in_stack_fffffffffffff3e0;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff410;
  TPZVec<Fad<double>_> *in_stack_fffffffffffff418;
  TPZFMatrix<double> *in_stack_fffffffffffff420;
  int local_81c;
  TPZVec<double> local_818;
  undefined8 local_7f8;
  undefined8 local_6c0;
  undefined8 local_4c8;
  undefined8 local_2d0;
  undefined8 local_c8;
  TPZVec<Fad<double>_> local_a0 [5];
  
  local_c8 = 0;
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffff110,(double *)in_stack_fffffffffffff108);
  TPZManVector<Fad<double>,_3>::TPZManVector
            (in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff100);
  local_2d0 = 0;
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffff110,(double *)in_stack_fffffffffffff108);
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff180,
             in_stack_fffffffffffff178);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff100);
  local_4c8 = 0;
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffff110,(double *)in_stack_fffffffffffff108);
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff180,
             in_stack_fffffffffffff178);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff100);
  local_6c0 = 0;
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffff110,(double *)in_stack_fffffffffffff108);
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff180,
             in_stack_fffffffffffff178);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff100);
  TPZGeoTriangle::X<Fad<double>>
            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
  local_7f8 = 0;
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffff110,(double *)in_stack_fffffffffffff108);
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<3,_Fad<double>_> *)in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180,in_stack_fffffffffffff178);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff100);
  TPZVec<double>::TPZVec(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  local_81c = 0;
  while( true ) {
    iVar1 = TPZVec<Fad<double>_>::size(local_a0);
    if (iVar1 <= local_81c) break;
    TPZVec<Fad<double>_>::operator[](local_a0,(long)local_81c);
    TPZVec<double>::operator[](&local_818,(long)local_81c);
    operator-<Fad<double>,_double,_nullptr>
              (in_stack_fffffffffffff158,(double)in_stack_fffffffffffff150);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
               (int64_t)in_stack_fffffffffffff110);
    Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
    FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffff100);
    local_81c = local_81c + 1;
  }
  ::Norm(in_stack_fffffffffffff160);
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffff110,(double *)in_stack_fffffffffffff108);
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(in_stack_fffffffffffff150);
  TPZGeoTriangle::GradX<Fad<double>>
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  operator+<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff138,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  operator+<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff138,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff120,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff118);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff100);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff100);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff100);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff100);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff100);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  operator+<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff138,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  operator+<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff138,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff120,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff118);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff100);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff100);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff100);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff100);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff100);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff138,
             in_stack_fffffffffffff130);
  Fad<double>::Fad<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>
            ((Fad<double> *)in_stack_fffffffffffff150,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff148);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff100);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff100);
  operator/<double,_Fad<double>,_nullptr>
            ((double)in_stack_fffffffffffff148,(Fad<double> *)in_stack_fffffffffffff140);
  Fad<double>::Fad<FadBinaryDiv<FadCst<double>,Fad<double>>>
            ((Fad<double> *)in_stack_fffffffffffff150,
             (FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff148);
  FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff100);
  Fad<double>::Fad((Fad<double> *)in_stack_fffffffffffff110,(Fad<double> *)in_stack_fffffffffffff108
                  );
  ::operator*(in_stack_fffffffffffff148,in_stack_fffffffffffff140);
  TPZFNMatrix<9,_Fad<double>_>::operator=(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)0x17d89ca);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffff100);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff120,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff118);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff100);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  this_00 = (TPZFMatrix<Fad<double>_> *)
            TPZFMatrix<Fad<double>_>::operator()
                      (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
                       (int64_t)in_stack_fffffffffffff110);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  A = (TPZFMatrix<Fad<double>_> *)
      TPZFMatrix<Fad<double>_>::operator()
                (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
                 (int64_t)in_stack_fffffffffffff110);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff120,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff118);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff100);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  val = TPZFMatrix<Fad<double>_>::operator()
                  (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
                   (int64_t)in_stack_fffffffffffff110);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff120,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff118);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff100);
  A_00 = (TPZFMatrix<Fad<double>_> *)
         TPZFMatrix<Fad<double>_>::operator()
                   (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
                    (int64_t)in_stack_fffffffffffff110);
  v = TPZFMatrix<Fad<double>_>::operator()
                (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
                 (int64_t)in_stack_fffffffffffff110);
  operator*<Fad<double>,_Fad<double>,_nullptr>(v,in_stack_fffffffffffff130);
  w = TPZFMatrix<Fad<double>_>::operator()
                (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
                 (int64_t)in_stack_fffffffffffff110);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff120,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff118);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff100);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
             (int64_t)in_stack_fffffffffffff110);
  this_01 = (TPZFMatrix<Fad<double>_> *)
            TPZFMatrix<Fad<double>_>::operator()
                      (in_stack_fffffffffffff120,(int64_t)in_stack_fffffffffffff118,
                       (int64_t)in_stack_fffffffffffff110);
  operator*<Fad<double>,_Fad<double>,_nullptr>(v,w);
  fadexpr = TPZFMatrix<Fad<double>_>::operator()
                      (this_01,(int64_t)in_stack_fffffffffffff118,(int64_t)in_stack_fffffffffffff110
                      );
  Fad<double>::operator=
            ((Fad<double> *)this_01,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)fadexpr);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff100);
  this_02 = (TPZManVector<Fad<double>,_3> *)
            TPZFMatrix<Fad<double>_>::operator()
                      (this_01,(int64_t)fadexpr,(int64_t)in_stack_fffffffffffff110);
  pFVar2 = TPZFMatrix<Fad<double>_>::operator()(this_01,(int64_t)fadexpr,(int64_t)this_02);
  operator*<Fad<double>,_Fad<double>,_nullptr>(v,w);
  this_03 = (TPZFMatrix<Fad<double>_> *)
            TPZFMatrix<Fad<double>_>::operator()(this_01,(int64_t)fadexpr,(int64_t)this_02);
  Fad<double>::operator=
            ((Fad<double> *)this_01,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)fadexpr);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)this_03);
  operator/<double,_Fad<double>,_nullptr>((double)val,(Fad<double> *)A_00);
  Fad<double>::operator=
            ((Fad<double> *)this_01,(FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *)fadexpr)
  ;
  FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *)this_03);
  Fad<double>::Fad((Fad<double> *)this_02,pFVar2);
  ::operator*(val,A_00);
  TPZFMatrix<Fad<double>_>::operator+(this_00,A);
  TPZFMatrix<Fad<double>_>::operator=(this_03,in_stack_fffffffffffff0f8);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)0x17d8e04);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)0x17d8e11);
  Fad<double>::~Fad((Fad<double> *)this_03);
  Fad<double>::~Fad((Fad<double> *)this_03);
  Fad<double>::~Fad((Fad<double> *)this_03);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x17d8e45);
  Fad<double>::~Fad((Fad<double> *)this_03);
  TPZVec<double>::~TPZVec((TPZVec<double> *)this_03);
  TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<3,_Fad<double>_> *)0x17d8e6c);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x17d8e79);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x17d8e86);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x17d8e93);
  TPZManVector<Fad<double>,_3>::~TPZManVector(this_02);
  return;
}

Assistant:

void GradX(TPZFMatrix<REAL> &cornerco, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
        {
            TPZManVector<T,3> XTriangle(3,0.0);
            TPZFNMatrix<9,T> GradOneoverNorm(3,1,0.0);
            TPZFNMatrix<9,T> TensorXtGradX(3,2,0.0);
            TPZFNMatrix<9,T> GradXtScaled(3,3,0.0);
            
            //            TPZFNMatrix<3*NNodes> coord(3,NNodes);
            //            CornerCoordinates(gel, coord);
            
            GeomTriang::X(cornerco,par,XTriangle);
            TPZFNMatrix<3,T> XtminusXc(3,1,0.0);
            TPZVec<REAL> Xc= fXc;
            
            for (int i = 0; i < XTriangle.size(); i++)
            { XtminusXc(i,0)= XTriangle[i] - Xc[i]; }
            T NormValue = Norm(XtminusXc);
            
            
            TPZFNMatrix<9,T> GradXt;
            GeomTriang::GradX(cornerco,par,GradXt);
            
            GradOneoverNorm(0,0) = XtminusXc(0,0)*GradXt(0,0)+XtminusXc(1,0)*GradXt(1,0)+XtminusXc(2,0)*GradXt(2,0);
            GradOneoverNorm(1,0) = XtminusXc(0,0)*GradXt(0,1)+XtminusXc(1,0)*GradXt(1,1)+XtminusXc(2,0)*GradXt(2,1);
            T a = (NormValue*NormValue*NormValue);
            T b = -fR/a;
            GradOneoverNorm = b*GradOneoverNorm;
            
            TensorXtGradX(0,0)= XtminusXc(0,0)*GradOneoverNorm(0,0);
            TensorXtGradX(0,1)= XtminusXc(0,0)*GradOneoverNorm(1,0);
            TensorXtGradX(1,0)= XtminusXc(1,0)*GradOneoverNorm(0,0);
            TensorXtGradX(1,1)= XtminusXc(1,0)*GradOneoverNorm(1,0);
            TensorXtGradX(2,0)= XtminusXc(2,0)*GradOneoverNorm(0,0);
            TensorXtGradX(2,1)= XtminusXc(2,0)*GradOneoverNorm(1,0);
            a = fR/NormValue;
            gradx=a*GradXt+TensorXtGradX;

        }